

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

void __thiscall
MADPComponentDiscreteActions::AddAction
          (MADPComponentDiscreteActions *this,Index AI,string *name,string *description)

{
  value_type vVar1;
  size_type sVar2;
  ostream *poVar3;
  undefined8 uVar4;
  reference pvVar5;
  string *in_RDX;
  uint in_ESI;
  long in_RDI;
  ActionDiscrete ad_1;
  Index newActionIndex;
  ActionDiscrete ad;
  vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> thisAgentsActions;
  stringstream ss;
  stringstream *in_stack_fffffffffffffd08;
  ActionDiscrete *in_stack_fffffffffffffd10;
  ActionDiscrete *this_00;
  value_type *in_stack_fffffffffffffd18;
  string *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  Index i;
  ActionDiscrete *in_stack_fffffffffffffd30;
  ActionDiscrete local_290;
  undefined4 local_234;
  undefined8 local_1c0;
  stringstream local_1a8 [16];
  ostream local_198 [384];
  string *local_18;
  uint local_c;
  
  i = (Index)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  local_18 = in_RDX;
  local_c = in_ESI;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40));
  if (sVar2 != local_c) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40));
    if (sVar2 != local_c + 1) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      poVar3 = std::operator<<(local_198,"MADPComponentDiscreteActions::AddAction(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = std::operator<<(poVar3,local_18);
      poVar3 = std::operator<<(poVar3,") - error, actions of agents should be specified in order!");
      poVar3 = std::operator<<(poVar3," first all actions of agent 1, then all of agent 2,...etc..."
                              );
      poVar3 = std::operator<<(poVar3," _m_nrActions.size now is: ");
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40));
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
      poVar3 = std::operator<<(poVar3,"\n(the vector _m_nrActions should contain entries for all ");
      std::operator<<(poVar3,"preceeding agents.)");
      uVar4 = __cxa_allocate_exception(0x28);
      E::E((E *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      __cxa_throw(uVar4,&E::typeinfo,E::~E);
    }
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40));
  if (sVar2 == local_c) {
    local_1c0 = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd10,
               (value_type_conflict2 *)in_stack_fffffffffffffd08);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::vector
              ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)0xacd159);
    ActionDiscrete::ActionDiscrete
              (in_stack_fffffffffffffd30,i,in_stack_fffffffffffffd20,
               (string *)in_stack_fffffffffffffd18);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::push_back
              ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18);
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::push_back((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                 *)in_stack_fffffffffffffd20,(value_type *)in_stack_fffffffffffffd18);
    ActionDiscrete::~ActionDiscrete(in_stack_fffffffffffffd10);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::~vector
              ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)in_stack_fffffffffffffd20)
    ;
  }
  else {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40),
                        (ulong)local_c);
    vVar1 = *pvVar5;
    *pvVar5 = vVar1 + 1;
    local_234 = (undefined4)vVar1;
    this_00 = &local_290;
    ActionDiscrete::ActionDiscrete
              (in_stack_fffffffffffffd30,i,in_stack_fffffffffffffd20,
               (string *)in_stack_fffffffffffffd18);
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::operator[]((vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  *)(in_RDI + 0x58),(ulong)local_c);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::push_back
              ((vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> *)in_stack_fffffffffffffd20,
               in_stack_fffffffffffffd18);
    ActionDiscrete::~ActionDiscrete(this_00);
  }
  return;
}

Assistant:

void MADPComponentDiscreteActions::AddAction(Index AI,
                                             const string &name,
                                             const string &description)
{
    if(DEBUG_ADD_DA)
        cerr <<  "MADPComponentDiscreteActions::AddAction("<<AI<<","<<name<<")"<<endl;

    if(_m_nrActions.size() != AI && _m_nrActions.size() != AI+1)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteActions::AddAction("<<AI<<","<<name<<
            ") - error, actions of agents should be specified in order!"<<
            " first all actions of agent 1, then all of agent 2,...etc..."<<
            " _m_nrActions.size now is: "<< _m_nrActions.size() <<
            "\n(the vector _m_nrActions should contain entries for all "<<
            "preceeding agents.)";
        throw(E(ss));
    }
    if(_m_nrActions.size() == AI )
    {
        //this is the first action we add for this agent
        _m_nrActions.push_back(1);

        vector<ActionDiscrete> thisAgentsActions;
        ActionDiscrete ad(0, name, description);
        thisAgentsActions.push_back(ad);
        _m_actionVecs.push_back(thisAgentsActions);
    }
    else
    {
        //we add an action for this agent - increment his nr_actions
        Index newActionIndex = _m_nrActions[AI]++;
        ActionDiscrete ad(newActionIndex, name, description);
        _m_actionVecs[AI].push_back(ad);
    }
}